

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v4.cxx
# Opt level: O1

void __thiscall
xray_re::xr_ogf_v4::bone_motion_io::import(bone_motion_io *this,xr_reader *r,uint_fast32_t num_keys)

{
  ogf_key_qr *poVar1;
  uint8_t *puVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  byte bVar9;
  byte *pbVar10;
  ogf_key_qr *value_00;
  fvector3 *value_01;
  float *pfVar11;
  _vector3<float> *p_1;
  ulong uVar12;
  char *pcVar13;
  short *psVar14;
  fvector3 value;
  anon_union_12_2_77b31271_for__vector3<float>_1 local_3c;
  
  xr_bone_motion::create_envelopes((xr_bone_motion *)this);
  pbVar10 = (r->field_2).m_p;
  (r->field_2).m_p = (uint8_t *)(pbVar10 + 1);
  bVar9 = *pbVar10;
  if ((bVar9 & 2) == 0) {
    (r->field_2).m_p = pbVar10 + 5;
    if (num_keys != 0) {
      uVar12 = 0;
      do {
        value_00 = (ogf_key_qr *)(r->field_2).m_p;
        poVar1 = value_00 + 1;
        (r->field_2).m_p = (uint8_t *)poVar1;
        if ((ogf_key_qr *)r->m_end < poVar1) goto LAB_00182f49;
        xr_ogf::bone_motion_io::insert_key
                  (&this->super_bone_motion_io,(float)uVar12 / 30.0,value_00);
        uVar12 = uVar12 + 1;
      } while (num_keys != uVar12);
    }
  }
  else {
    (r->field_2).m_p = pbVar10 + 9;
    if (r->m_end < pbVar10 + 9) goto LAB_00182f49;
    xr_ogf::bone_motion_io::insert_key(&this->super_bone_motion_io,0.0,(ogf_key_qr *)(pbVar10 + 1));
  }
  value_01 = (fvector3 *)(r->field_2).m_p;
  if ((bVar9 & 1) == 0) {
    (r->field_2).m_p = (uint8_t *)(value_01 + 1);
    if (value_01 + 1 <= (fvector3 *)r->m_end) {
      xr_ogf::bone_motion_io::insert_key(&this->super_bone_motion_io,0.0,value_01);
      return;
    }
  }
  else {
    puVar2 = (uint8_t *)((long)&value_01->field_0 + 4);
    (r->field_2).m_p = puVar2;
    if ((bVar9 & 4) == 0) {
      pfVar11 = (float *)(puVar2 + num_keys * 3);
      (r->field_2).m_p_f = pfVar11;
      if (pfVar11 <= r->m_end) {
        (r->field_2).m_p = (uint8_t *)(pfVar11 + 1);
        fVar3 = *pfVar11;
        (r->field_2).m_p = (uint8_t *)(pfVar11 + 2);
        fVar4 = pfVar11[1];
        (r->field_2).m_p = (uint8_t *)(pfVar11 + 3);
        fVar5 = pfVar11[2];
        (r->field_2).m_p = (uint8_t *)(pfVar11 + 4);
        fVar6 = pfVar11[3];
        (r->field_2).m_p = (uint8_t *)(pfVar11 + 5);
        fVar7 = pfVar11[4];
        (r->field_2).m_p = (uint8_t *)(pfVar11 + 6);
        if (num_keys != 0) {
          fVar8 = pfVar11[5];
          pcVar13 = (char *)((long)&value_01->field_0 + 6);
          uVar12 = 0;
          do {
            local_3c.field_0.z = (float)(int)*pcVar13 * fVar5 + fVar8;
            local_3c.field_0.x = (float)(int)pcVar13[-2] * fVar3 + fVar6;
            local_3c.field_0.y = (float)(int)pcVar13[-1] * fVar4 + fVar7;
            xr_ogf::bone_motion_io::insert_key
                      (&this->super_bone_motion_io,(float)uVar12 / 30.0,
                       (fvector3 *)&local_3c.field_0);
            uVar12 = uVar12 + 1;
            pcVar13 = pcVar13 + 3;
          } while (num_keys != uVar12);
        }
        return;
      }
    }
    else {
      pfVar11 = (float *)(puVar2 + num_keys * 6);
      (r->field_2).m_p_f = pfVar11;
      if (pfVar11 <= r->m_end) {
        (r->field_2).m_p = (uint8_t *)(pfVar11 + 1);
        fVar3 = *pfVar11;
        (r->field_2).m_p = (uint8_t *)(pfVar11 + 2);
        fVar4 = pfVar11[1];
        (r->field_2).m_p = (uint8_t *)(pfVar11 + 3);
        fVar5 = pfVar11[2];
        (r->field_2).m_p = (uint8_t *)(pfVar11 + 4);
        fVar6 = pfVar11[3];
        (r->field_2).m_p = (uint8_t *)(pfVar11 + 5);
        fVar7 = pfVar11[4];
        (r->field_2).m_p = (uint8_t *)(pfVar11 + 6);
        if (num_keys == 0) {
          return;
        }
        fVar8 = pfVar11[5];
        psVar14 = (short *)((long)&value_01->field_0 + 8);
        uVar12 = 0;
        do {
          local_3c.field_0.z = (float)(int)*psVar14 * fVar5 + fVar8;
          local_3c.field_0.x = (float)(int)psVar14[-2] * fVar3 + fVar6;
          local_3c.field_0.y = (float)(int)psVar14[-1] * fVar4 + fVar7;
          xr_ogf::bone_motion_io::insert_key
                    (&this->super_bone_motion_io,(float)uVar12 / 30.0,(fvector3 *)&local_3c.field_0)
          ;
          uVar12 = uVar12 + 1;
          psVar14 = psVar14 + 3;
        } while (num_keys != uVar12);
        return;
      }
    }
  }
LAB_00182f49:
  __assert_fail("m_p <= m_end",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_reader.h"
                ,0x7c,"void xray_re::xr_reader::advance(size_t)");
}

Assistant:

void xr_ogf_v4::bone_motion_io::import(xr_reader& r, uint_fast32_t num_keys)
{
	create_envelopes();

	unsigned flags = r.r_u8();

	if (flags & KPF_R_ABSENT) {
		insert_key(0, r.skip<ogf_key_qr>());
	} else {
		r.r_u32();
		for (size_t i = 0; i != num_keys; ++i)
			insert_key(i/OGF4_MOTION_FPS, r.skip<ogf_key_qr>());
	}
	if (flags & KPF_T_PRESENT) {
		r.r_u32();
		fvector3 t_init, t_size, value;
		if (flags & KPF_T_HQ) {
			const ogf4_key_qt_hq* keys_qt = r.skip<ogf4_key_qt_hq>(num_keys);
			r.r_fvector3(t_size);
			r.r_fvector3(t_init);
			for (uint_fast32_t i = 0; i != num_keys; ++i) {
				keys_qt[i].dequantize(value, t_size);
				value.add(t_init);
				insert_key(float(i)/OGF4_MOTION_FPS, &value);
			}
		} else {
			const ogf4_key_qt* keys_qt = r.skip<ogf4_key_qt>(num_keys);
			r.r_fvector3(t_size);
			r.r_fvector3(t_init);
			for (uint_fast32_t i = 0; i != num_keys; ++i) {
				keys_qt[i].dequantize(value, t_size);
				value.add(t_init);
				insert_key(float(i)/OGF4_MOTION_FPS, &value);
			}
		}
	} else {
		insert_key(0, r.skip<fvector3>());
	}
}